

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::Pop(cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  PositionType position;
  iterator it;
  iterator it_00;
  bool bVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  size_type sVar5;
  PointerType pSVar6;
  undefined1 local_38 [8];
  PositionType prevPos;
  PositionType pos;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  local_38 = (undefined1  [8])(originSnapshot->Position).Tree;
  pcVar1 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(originSnapshot->Position).Position;
  prevPos.Tree = pcVar1;
  prevPos.Position = (PositionType)local_38;
  cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++((iterator *)local_38);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  sVar5 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&pBVar4->IncludeDirectories);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pSVar3->IncludeDirectoryPosition = sVar5;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  sVar5 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&pBVar4->CompileDefinitions);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pSVar3->CompileDefinitionsPosition = sVar5;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  sVar5 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&pBVar4->CompileOptions);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pSVar3->CompileOptionsPosition = sVar5;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  sVar5 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&pBVar4->LinkOptions);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pSVar3->LinkOptionsPosition = sVar5;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  sVar5 = std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&pBVar4->LinkDirectories);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pSVar3->LinkDirectoriesPosition = sVar5;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_38)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->CurrentScope).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_38;
  (pBVar4->CurrentScope).Position = (PositionType)prevPos.Tree;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)&prevPos.Position);
  if (((pSVar3->Keep & 1U) == 0) &&
     (it_00.Position = (PositionType)pcVar1,
     it_00.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)prevPos.Position,
     bVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::IsLast(&this->SnapshotData,it_00), bVar2
     )) {
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)&prevPos.Position);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)local_38);
    bVar2 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&pSVar3->Vars,pSVar6->Vars);
    if (bVar2) {
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      bVar2 = cmLinkedTree<cmDefinitions>::IsLast(&this->VarTree,pSVar3->Vars);
      if (!bVar2) {
        __assert_fail("this->VarTree.IsLast(pos->Vars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx"
                      ,0x3fe,"cmStateSnapshot cmState::Pop(const cmStateSnapshot &)");
      }
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      cmLinkedTree<cmDefinitions>::Pop(&this->VarTree,pSVar3->Vars);
    }
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)&prevPos.Position);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       ((iterator *)local_38);
    bVar2 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::iterator::operator!=(&pSVar3->ExecutionListFile,pSVar6->ExecutionListFile);
    if (bVar2) {
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      bVar2 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::IsLast(&this->ExecutionListFiles,pSVar3->ExecutionListFile);
      if (!bVar2) {
        __assert_fail("this->ExecutionListFiles.IsLast(pos->ExecutionListFile)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx"
                      ,0x402,"cmStateSnapshot cmState::Pop(const cmStateSnapshot &)");
      }
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         ((iterator *)&prevPos.Position);
      cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Pop(&this->ExecutionListFiles,pSVar3->ExecutionListFile);
    }
    it.Position = (PositionType)pcVar1;
    it.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)prevPos.Position;
    cmLinkedTree<cmStateDetail::SnapshotDataType>::Pop(&this->SnapshotData,it);
  }
  position.Position = (PositionType)prevPos.Tree;
  position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_38;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::Pop(cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos = originSnapshot.Position;
  cmStateDetail::PositionType prevPos = pos;
  ++prevPos;
  prevPos->IncludeDirectoryPosition =
    prevPos->BuildSystemDirectory->IncludeDirectories.size();
  prevPos->CompileDefinitionsPosition =
    prevPos->BuildSystemDirectory->CompileDefinitions.size();
  prevPos->CompileOptionsPosition =
    prevPos->BuildSystemDirectory->CompileOptions.size();
  prevPos->LinkOptionsPosition =
    prevPos->BuildSystemDirectory->LinkOptions.size();
  prevPos->LinkDirectoriesPosition =
    prevPos->BuildSystemDirectory->LinkDirectories.size();
  prevPos->BuildSystemDirectory->CurrentScope = prevPos;

  if (!pos->Keep && this->SnapshotData.IsLast(pos)) {
    if (pos->Vars != prevPos->Vars) {
      assert(this->VarTree.IsLast(pos->Vars));
      this->VarTree.Pop(pos->Vars);
    }
    if (pos->ExecutionListFile != prevPos->ExecutionListFile) {
      assert(this->ExecutionListFiles.IsLast(pos->ExecutionListFile));
      this->ExecutionListFiles.Pop(pos->ExecutionListFile);
    }
    this->SnapshotData.Pop(pos);
  }

  return { this, prevPos };
}